

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string *name,bool expecting_enum)

{
  Type TVar1;
  ulong uVar2;
  char *pcVar3;
  byte in_DL;
  string *in_RSI;
  Symbol SVar5;
  Tables *unaff_retaddr;
  string lookup_name;
  Symbol result;
  string local_78 [48];
  string local_48 [39];
  byte local_21;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  DescriptorPool *in_stack_fffffffffffffff8;
  anon_union_8_8_13f84498_for_Symbol_2 aVar4;
  
  local_21 = in_DL & 1;
  std::__cxx11::string::string(local_48,in_RSI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (*pcVar3 == '.') {
      std::__cxx11::string::substr((ulong)local_78,(ulong)local_48);
      std::__cxx11::string::operator=(local_48,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4cea18);
  SVar5 = Tables::FindByNameHelper
                    (unaff_retaddr,in_stack_fffffffffffffff8,
                     (string *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  aVar4 = SVar5.field_1;
  TVar1 = SVar5.type;
  std::__cxx11::string::~string(local_48);
  SVar5._4_4_ = 0;
  SVar5.type = TVar1;
  SVar5.field_1.descriptor = aVar4.descriptor;
  return SVar5;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(const std::string& name,
                                               bool expecting_enum) const {
  std::string lookup_name = name;
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}